

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O0

void PyreNet::LayerThreadPool::threadJob(void)

{
  Perceptron *this;
  Activation *activation;
  int *piVar1;
  bool bVar2;
  reference pvVar3;
  lock_guard<std::mutex> local_60;
  lock_guard<std::mutex> lgt;
  LayerQueueJob job;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lg;
  LayerThreadPool *tpi;
  
  lg._8_8_ = getInstance();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_20,&((LayerThreadPool *)lg._8_8_)->queueMutex);
  do {
    while (bVar2 = std::
                   queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
                   ::empty((queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
                            *)(lg._8_8_ + 200)), bVar2) {
      std::condition_variable::wait((unique_lock *)(lg._8_8_ + 0x48));
    }
    pvVar3 = std::
             queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
             ::front((queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
                      *)(lg._8_8_ + 200));
    lgt._M_device = (mutex_type *)pvVar3->input;
    this = pvVar3->p;
    activation = pvVar3->activation;
    piVar1 = pvVar3->track;
    std::
    queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
    ::pop((queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
           *)(lg._8_8_ + 200));
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
    Perceptron::calculate(this,(vector<double,_std::allocator<double>_> *)lgt._M_device,activation);
    std::lock_guard<std::mutex>::lock_guard(&local_60,(mutex_type *)(lg._8_8_ + 0x78));
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
    std::lock_guard<std::mutex>::~lock_guard(&local_60);
  } while( true );
}

Assistant:

[[noreturn]] void LayerThreadPool::threadJob() {
        LayerThreadPool* tpi = getInstance();
        std::unique_lock<std::mutex> lg(tpi->queueMutex);
        while (true) {
            if (!tpi->layerQueue.empty()) {
                LayerQueueJob job = tpi->layerQueue.front();
                tpi->layerQueue.pop();
                lg.unlock();
                job.p.calculate(job.input, job.activation);
                std::lock_guard<std::mutex> lgt(tpi->trackMutex);
                job.track--;
                if (job.track == 0) {
                    tpi->jobDoneCv.notify_all();
                }
                lg.lock();
            } else {
                tpi->newJobCv.wait(lg);
            }
        }
    }